

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O3

bool __thiscall
FIX::SocketAcceptor::onData(SocketAcceptor *this,SocketServer *server,socket_handle s)

{
  _Rb_tree_header *p_Var1;
  ssize_t sVar2;
  _Base_ptr __nbytes;
  _Base_ptr p_Var3;
  
  p_Var3 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var1 = &(this->m_connections)._M_t._M_impl.super__Rb_tree_header;
    __nbytes = &p_Var1->_M_header;
    do {
      if (s <= (int)p_Var3[1]._M_color) {
        __nbytes = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < s];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)__nbytes != p_Var1) && ((int)__nbytes[1]._M_color <= s)) {
      sVar2 = SocketConnection::read
                        ((SocketConnection *)__nbytes[1]._M_parent,(int)this,server,(size_t)__nbytes
                        );
      return SUB81(sVar2,0);
    }
  }
  return false;
}

Assistant:

bool SocketAcceptor::onData(SocketServer &server, socket_handle s) {
  SocketConnections::iterator i = m_connections.find(s);
  if (i == m_connections.end()) {
    return false;
  }
  SocketConnection *pSocketConnection = i->second;
  return pSocketConnection->read(*this, server);
}